

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequencer.cpp
# Opt level: O3

void __thiscall egc::Sequencer::INDEXE(Sequencer *this,unsigned_short instruction)

{
  long lVar1;
  long lVar2;
  unsigned_short index;
  ostream *poVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"INDEXE",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 0x40;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  lVar1 = *(long *)poVar3;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar3 + lVar2 + 0x18) = *(uint *)(poVar3 + lVar2 + 0x18) & 0xffffffb5 | 2;
  std::ios::widen((char)*(undefined8 *)(lVar1 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  index = Memory::Read((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,instruction & 0xfff,0);
  Memory::SetIndex((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,index);
  Memory::Write((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                instruction & 0xfff,index);
  Memory::SetExtendFlag
            ((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  return;
}

Assistant:

void egc::Sequencer::INDEXE (unsigned short instruction)
{
    unsigned short k = instruction & 007777u;

    std::cout << "INDEXE" << " " << std::oct << k << std::dec << std::endl;

    auto mk = m_Memory->Read(k);
    m_Memory->SetIndex(mk);

    m_Memory->Write(k, mk);

    m_Memory->SetExtendFlag();
}